

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O1

void __thiscall
ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
init_matrices(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              *this,int t1_size,int k)

{
  pointer pdVar1;
  pointer pdVar2;
  size_t sVar3;
  Matrix<double> local_58;
  size_t local_30;
  
  sVar3 = (size_t)k;
  data_structures::Matrix<double>::Matrix(&local_58,(long)t1_size,sVar3 * 2 + 1);
  *(undefined4 *)&(this->td_).super_Matrix<double>.rows_ = (undefined4)local_58.rows_;
  *(undefined4 *)((long)&(this->td_).super_Matrix<double>.rows_ + 4) = local_58.rows_._4_4_;
  *(undefined4 *)&(this->td_).super_Matrix<double>.columns_ = (undefined4)local_58.columns_;
  *(undefined4 *)((long)&(this->td_).super_Matrix<double>.columns_ + 4) = local_58.columns_._4_4_;
  local_30 = sVar3;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->td_).super_Matrix<double>.data_,&local_58.data_);
  (this->td_).band_width_ = local_30;
  if (local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  pdVar1 = (this->td_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (this->td_).super_Matrix<double>.data_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = INFINITY;
  }
  data_structures::Matrix<double>::Matrix(&local_58,(long)(t1_size + 1),sVar3 * 2 + 3);
  *(undefined4 *)&(this->fd_).super_Matrix<double>.rows_ = (undefined4)local_58.rows_;
  *(undefined4 *)((long)&(this->fd_).super_Matrix<double>.rows_ + 4) = local_58.rows_._4_4_;
  *(undefined4 *)&(this->fd_).super_Matrix<double>.columns_ = (undefined4)local_58.columns_;
  *(undefined4 *)((long)&(this->fd_).super_Matrix<double>.columns_ + 4) = local_58.columns_._4_4_;
  local_30 = sVar3 + 1;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->fd_).super_Matrix<double>.data_,&local_58.data_);
  (this->fd_).band_width_ = local_30;
  if (local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  pdVar1 = (this->fd_).super_Matrix<double>.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (this->fd_).super_Matrix<double>.data_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = INFINITY;
  }
  return;
}

Assistant:

void init_matrices(int t1_size, int k) {
    using data_structures::BandMatrix;
    // NOTE: The default constructor of Matrix is called while constructing
    //       the algorithm object.
    // QUESTION: Shouldn't we implement Matrix::resize() instead of constructing
    //           matrix again?
    // NOTE: The k may be larger than |T2| that uses more memory than needed.
    td_ = BandMatrix<double>(t1_size, k);
    // Fill in for initially marking all subtree pairs as not eligable, and for debugging.
    // td_.fill_with(std::numeric_limits<double>::signaling_NaN());
    td_.Matrix::fill_with(std::numeric_limits<double>::infinity());
    // NOTE: The band_width=e for Touzet's fd_ matrix varies. It is however
    //       smaller or equal to the initialised band_width=k+1. As long as we
    //       read and write using the original band_width, addresses are not
    //       messed up. We only have to ensure that we do not iterate over too
    //       many elements using k instead of e.
    fd_ = BandMatrix<double>(t1_size + 1, k + 1);
    fd_.Matrix::fill_with(std::numeric_limits<double>::infinity());
  }